

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

Gia_Man_t * Abc_NtkDeriveFlatGia2(Abc_Ntk_t *pNtk,Vec_Ptr_t *vModels)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *vOrder;
  Gia_Man_t *pGVar2;
  void *pvVar3;
  int iVar4;
  
  pNtk_00 = (Abc_Ntk_t *)0x0;
  for (iVar4 = 0; iVar1 = vModels->nSize, iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(vModels,iVar4);
    vOrder = Abc_NtkDfsBoxes(pNtk_00);
    pGVar2 = Abc_NtkDeriveFlatGia2Derive(pNtk_00,vOrder);
    pNtk_00->pData = pGVar2;
    Vec_PtrFree(vOrder);
  }
  pGVar2 = (Gia_Man_t *)pNtk_00->pData;
  pNtk_00->pData = (void *)0x0;
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(vModels,iVar4);
    Gia_ManStopP((Gia_Man_t **)((long)pvVar3 + 0x158));
    iVar1 = vModels->nSize;
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia2( Abc_Ntk_t * pNtk, Vec_Ptr_t * vModels )
{ 
    Vec_Ptr_t * vOrder;
    Abc_Ntk_t * pModel = NULL;
    Gia_Man_t * pGia = NULL;
    int i;

    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pModel, i )
    {
        vOrder = Abc_NtkDfsBoxes( pModel );
        pModel->pData = Abc_NtkDeriveFlatGia2Derive( pModel, vOrder );
        Vec_PtrFree( vOrder );
    }

    pGia = (Gia_Man_t *)pModel->pData;  pModel->pData = NULL;

    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pModel, i )
        Gia_ManStopP( (Gia_Man_t **)&pModel->pData );

    return pGia;
}